

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::TriangleDraw::FragmentShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  allocator<char> local_19;
  void *local_18;
  TriangleDraw *this_local;
  
  local_18 = this;
  this_local = (TriangleDraw *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             "#version 400                                      \nin vec2 texcoords;                                \nout vec4 FragColor;                               \nuniform sampler2D tex;                            \nvoid main() {                                     \n   FragColor = textureGather(tex, texcoords, 2);  \n}\n"
             ,&local_19);
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string FragmentShader()
	{
		return "#version 400                                      \n"
			   "in vec2 texcoords;                                \n"
			   "out vec4 FragColor;                               \n"
			   "uniform sampler2D tex;                            \n"
			   "void main() {                                     \n"
			   "   FragColor = textureGather(tex, texcoords, 2);  \n"
			   "}\n";
	}